

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_capi_profiling.cpp
# Opt level: O0

void TraverseTree(duckdb_profiling_info profiling_info,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *cumulative_counter,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *cumulative_result,idx_t depth)

{
  StringRef capturedExpression;
  ulong depth_00;
  ExprLhs<const_unsigned_long_&> this;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_RCX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_RDX;
  duckdb_profiling_info in_RSI;
  undefined8 in_RDI;
  duckdb_profiling_info child;
  idx_t i;
  AssertionHandler catchAssertionHandler;
  idx_t child_count;
  idx_t in_stack_00000db8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_stack_00000dc0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_stack_00000dc8;
  duckdb_profiling_info in_stack_00000dd0;
  undefined4 in_stack_fffffffffffffee8;
  Flags in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  AssertionHandler *this_00;
  StringRef *in_stack_fffffffffffffef8;
  AssertionHandler *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  ulong uVar1;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int *in_stack_ffffffffffffff20;
  AssertionHandler local_90;
  
  RetrieveMetrics(in_stack_00000dd0,in_stack_00000dc8,in_stack_00000dc0,in_stack_00000db8);
  depth_00 = duckdb_profiling_info_get_child_count(in_RDI);
  if (in_RCX == (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *)0x0) {
    local_90.m_assertionInfo.lineInfo =
         (SourceLineInfo)
         operator____catch_sr
                   (in_stack_fffffffffffffef0,
                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    this_00 = &local_90;
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/test_capi_profiling.cpp"
               ,0x5f);
    Catch::StringRef::StringRef
              ((StringRef *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    capturedExpression.m_size._0_4_ = in_stack_ffffffffffffff10;
    capturedExpression.m_start = (char *)in_stack_ffffffffffffff08;
    capturedExpression.m_size._4_4_ = in_stack_ffffffffffffff14;
    Catch::AssertionHandler::AssertionHandler
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(SourceLineInfo *)this_00,
               capturedExpression,in_stack_fffffffffffffeec);
    this = Catch::Decomposer::operator<=
                     ((Decomposer *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                      (unsigned_long *)0x404991);
    Catch::ExprLhs<unsigned_long_const&>::operator!=
              ((ExprLhs<const_unsigned_long_&> *)this.m_lhs,in_stack_ffffffffffffff20);
    Catch::AssertionHandler::handleExpr
              (this_00,(ITransientExpression *)
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    Catch::BinaryExpr<const_unsigned_long_&,_const_int_&>::~BinaryExpr
              ((BinaryExpr<const_unsigned_long_&,_const_int_&> *)0x4049de);
    Catch::AssertionHandler::complete(this_00);
    Catch::AssertionHandler::~AssertionHandler(this_00);
  }
  for (uVar1 = 0; uVar1 < depth_00; uVar1 = uVar1 + 1) {
    duckdb_profiling_info_get_child(in_RDI,uVar1);
    TraverseTree(in_RSI,in_RDX,in_RCX,depth_00);
  }
  return;
}

Assistant:

void TraverseTree(duckdb_profiling_info profiling_info, duckdb::map<string, double> &cumulative_counter,
                  duckdb::map<string, double> &cumulative_result, const idx_t depth) {

	RetrieveMetrics(profiling_info, cumulative_counter, cumulative_result, depth);

	// Recurse into the child node.
	auto child_count = duckdb_profiling_info_get_child_count(profiling_info);
	if (depth == 0) {
		REQUIRE(child_count != 0);
	}

	for (idx_t i = 0; i < child_count; i++) {
		auto child = duckdb_profiling_info_get_child(profiling_info, i);
		TraverseTree(child, cumulative_counter, cumulative_result, depth + 1);
	}
}